

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O2

void guanyu(dw_rom *rom)

{
  doae(rom);
  vpatch(rom,0x1a8b,5,0x30,0x27,3,0x27,0x35);
  vpatch(rom,0x12260,0x40,0,0,0xc0,0x20,0x60,0,0xf0,0xe0,0x80,0xc0,0xc0,0xe0,0xe0,0xf0,0xf0,0xf0,
         0xf0,0,0xf0,0x70,0xe0,0x20,0xc0,0,0xf0,0xf0,0xf8,0xf8,0xe0,0xe0,0xc0,0x80,0,0,0xc0,0x20,
         0x60,0,0xf0,0xe0,0x80,0xc0,0xc0,0xe0,0xe0,0xf0,0xf0,0xfc,0xf0,0x10,0xf0,0xf0,0xc0,0x30,0xe0
         ,0,0xfc,0xfc,0xf0,0xf0,0xf0,0xfc,0xf8,0x10);
  vpatch(rom,0x12300,0x80,0,0,3,5,10,9,0xc,0xf,1,3,7,7,0xf,0xf,0x1f,0x3f,0x2e,0x77,0x7b,0x7c,3,0x1d,
         0x1f,1,0x3f,0x7f,0x7f,0x7f,0x5f,0x1e,0x1f,0x1f,0,0,3,5,10,9,0xc,0x6f,1,3,7,7,0xf,0x1f,0x3f,
         0x7f,0xe,0x17,0x3b,0x3c,3,0x1d,3,3,0xff,0xff,0xff,0x3f,0x1f,0x1e,0xf,3,0);
  vpatch(rom,0x12400,0x180,0,0,0x13,0x35,0x3a,0x79,0x7c,0x7f,1,3,7,7,0xf,0xf,0xf,0xf,0x7e,0xf7,0xf3,
         0xc4,0x4b,0xd,0x1f,0x11,0xf,0xcf,0xef,0xff,0x7f,0x3e,0xf,0xf,0,0,0xd0,0xb8,0x50,0x90,0x30,
         0xf6,0x80,0xc0,0xe0,0xe0,0xf0,0xf8,0xfc,0xfe,0x70,0xe8,0xdc,0x3c,0xc0,0xb8,0xc0,0xc0,0xff,
         0xff,0xff,0xfc,0xf8,0x78,0xf0,0xc0,0x20);
  vpatch(rom,0x12a20,0x70,0x60,0xe0,0x70,0xff,0x61,0x1e,1,0,0x7f,0xff,0xff,0x3f,0x1f,0x1f,0xf,0,3,7,
         0xe,0xf8,0xc0,0x38,0xf8,0,0xff,0xff,0xfe,0xf8,0xf8,0xf8,0xf8,0xf0,0,0,0xf,0x1b,4,0xf,0xf,
         0x25,1,3,0,4,7,0xf,0x1f,0x3f,0,6,0xf,3,0x23,0xf9,0xf7,0xa3,0x80,0xc6,0xef,0xef,0xef,0xf7,
         0xf9,0xff,0xc0);
  vpatch(rom,0x12aa0,0x10,0xf,0xf0,0xff,0xff,0xce,0xf1,0x7e,0,0xff,0xff,0xff,0xff,0xff,0xff,0xff,
         0xc3);
  vpatch(rom,0x12ac0,0x10,0,6,0xf,3,0x23,0xf9,0xf7,0xa7,0x80,0xc6,0xef,0xef,0xef,0xf7,0xf9,0xfd);
  vpatch(rom,0x12ae0,0x10,7,0xf8,0xff,0xf3,7,0xf1,0x7e,0,0xff,0xff,0xff,0xff,0xff,0xff,0x7e,0x3c);
  vpatch(rom,0x12b50,0x10,0,0,0x7a,0xb7,0x4a,0x32,0x86,0xfe,0x30,0x78,0xfc,0xfc,0xfe,0xff,0xff,0xff)
  ;
  vpatch(rom,0x12b80,0x20,0,4,0x7a,0xb4,0x4a,0x32,0x86,0xfe,0x30,0x78,0xfc,0xfc,0xfe,0xfe,0xff,0xff,
         0,0x18,0x86,0x59,0x3b,0xe8,0xef,0x7f,0x3c,0x7e,0x7e,0xbf,0xff,0xff,0xff,0xff);
  vpatch(rom,0x12bd0,0x10,0,0x18,6,0xd9,0x3b,0xe8,0xef,0x7f,0x3c,0x7e,0x7e,0x3f,0xff,0xff,0xff,0xff)
  ;
  return;
}

Assistant:

static void guanyu(dw_rom *rom)
{
    doae(rom);
    vpatch(rom, 0x01a8b,   5, 0x30, 0x27, 0x03, 0x27, 0x35);
    vpatch(rom, 0x12260,  64, 0x00, 0x00, 0xC0, 0x20, 0x60, 0x00, 0xF0, 0xE0, 0x80, 0xC0, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xF0, 0xF0, 0x00, 0xF0, 0x70, 0xE0, 0x20, 0xC0, 0x00, 0xF0, 0xF0, 0xF8, 0xF8, 0xE0, 0xE0, 0xC0, 0x80, 0x00, 0x00, 0xC0, 0x20, 0x60, 0x00, 0xF0, 0xE0, 0x80, 0xC0, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xFC, 0xF0, 0x10, 0xF0, 0xF0, 0xC0, 0x30, 0xE0, 0x00, 0xFC, 0xFC, 0xF0, 0xF0, 0xF0, 0xFC, 0xF8, 0x10);
    vpatch(rom, 0x12300, 128, 0x00, 0x00, 0x03, 0x05, 0x0A, 0x09, 0x0C, 0x0F, 0x01, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x1F, 0x3F, 0x2E, 0x77, 0x7B, 0x7C, 0x03, 0x1D, 0x1F, 0x01, 0x3F, 0x7F, 0x7F, 0x7F, 0x5F, 0x1E, 0x1F, 0x1F, 0x00, 0x00, 0x03, 0x05, 0x0A, 0x09, 0x0C, 0x6F, 0x01, 0x03, 0x07, 0x07, 0x0F, 0x1F, 0x3F, 0x7F, 0x0E, 0x17, 0x3B, 0x3C, 0x03, 0x1D, 0x03, 0x03, 0xFF, 0xFF, 0xFF, 0x3F, 0x1F, 0x1E, 0x0F, 0x03, 0x00, 0x00, 0x00, 0x00, 0x20, 0xF0, 0xF0, 0xA4, 0x80, 0xC0, 0xE0, 0xE0, 0xE0, 0xF0, 0xF8, 0xFC, 0x06, 0x07, 0x0E, 0xFC, 0x80, 0x78, 0x80, 0x00, 0xFE, 0xFF, 0xFF, 0xFF, 0xF8, 0xF8, 0xF0, 0x00, 0x00, 0x00, 0x00, 0x00, 0x20, 0xF0, 0xF0, 0xA6, 0x80, 0xC0, 0xE0, 0xE0, 0xE0, 0xF0, 0xF8, 0xFE, 0x03, 0x03, 0x06, 0xFC, 0xC0, 0x38, 0xF8, 0x00, 0xFF, 0xFF, 0xFE, 0xFC, 0xF8, 0xF8, 0xF8, 0xF0);
    vpatch(rom, 0x12400, 384, 0x00, 0x00, 0x13, 0x35, 0x3A, 0x79, 0x7C, 0x7F, 0x01, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x0F, 0x0F, 0x7E, 0xF7, 0xF3, 0xC4, 0x4B, 0x0D, 0x1F, 0x11, 0x0F, 0xCF, 0xEF, 0xFF, 0x7F, 0x3E, 0x0F, 0x0F, 0x00, 0x00, 0xD0, 0xB8, 0x50, 0x90, 0x30, 0xF6, 0x80, 0xC0, 0xE0, 0xE0, 0xF0, 0xF8, 0xFC, 0xFE, 0x70, 0xE8, 0xDC, 0x3C, 0xC0, 0xB8, 0xC0, 0xC0, 0xFF, 0xFF, 0xFF, 0xFC, 0xF8, 0x78, 0xF0, 0xC0, 0x20, 0x60, 0x63, 0xE5, 0xEA, 0xE9, 0xEC, 0xEF, 0x01, 0x03, 0x07, 0x07, 0x0F, 0x1F, 0x1F, 0x9F, 0x8E, 0x87, 0x9B, 0x7C, 0x23, 0x1D, 0x03, 0x03, 0xFF, 0xFF, 0xFF, 0x5F, 0x1F, 0x1E, 0x0F, 0x03, 0x00, 0x20, 0xD0, 0xA0, 0x50, 0x90, 0x30, 0xF0, 0x80, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xF8, 0xFC, 0x74, 0xEE, 0xDE, 0x3E, 0xC0, 0xB8, 0xF8, 0x80, 0xFC, 0xFE, 0xFE, 0xFE, 0xFA, 0x78, 0xF8, 0xF8, 0x00, 0x00, 0x07, 0x0B, 0x1C, 0x0F, 0x0F, 0x45, 0x01, 0x03, 0x00, 0x04, 0x07, 0x0F, 0x1F, 0x7F, 0xC0, 0xC0, 0xE0, 0x7F, 0x23, 0x1C, 0x1F, 0x00, 0xFF, 0xFF, 0xFF, 0x7F, 0x3F, 0x1F, 0x1F, 0x0F, 0x04, 0x06, 0x06, 0x07, 0x27, 0xF7, 0xF4, 0xA6, 0x80, 0xC0, 0xE0, 0xE0, 0xE0, 0xF0, 0xF8, 0xFE, 0x07, 0x07, 0x0E, 0xFC, 0x84, 0x7C, 0x80, 0x00, 0xFF, 0xFF, 0xFE, 0xFC, 0xF8, 0xF8, 0xF0, 0x00, 0x00, 0x00, 0x0F, 0x1B, 0x04, 0x0F, 0x0F, 0x05, 0x01, 0x03, 0x00, 0x04, 0x07, 0x0F, 0x1F, 0x3F, 0x60, 0xE0, 0x70, 0x3F, 0x01, 0x1E, 0x01, 0x00, 0x7F, 0xFF, 0xFF, 0xFF, 0x1F, 0x1F, 0x0F, 0x00, 0x00, 0x00, 0x08, 0x0C, 0x2C, 0xFE, 0xFE, 0xA6, 0x80, 0xC0, 0xE0, 0xE0, 0xE0, 0xF0, 0xF0, 0xFE, 0x02, 0x02, 0x04, 0xFC, 0xC0, 0x38, 0xF8, 0x00, 0xFE, 0xFE, 0xFC, 0xFC, 0xF8, 0xF8, 0xF8, 0xF0, 0x00, 0x03, 0x00, 0x13, 0x67, 0x1D, 0x3D, 0x2F, 0x07, 0x0F, 0x0F, 0x0F, 0x1F, 0x1F, 0x3F, 0x3F, 0x00, 0x3F, 0x3F, 0x3E, 0x00, 0x1E, 0x0F, 0x00, 0x7F, 0xFF, 0xBF, 0x3F, 0x1F, 0x1F, 0x0F, 0x07, 0x00, 0x00, 0xC8, 0x2C, 0x6C, 0x0E, 0xFE, 0xEE, 0x80, 0xC0, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xF0, 0xFE, 0x0C, 0xF0, 0x70, 0xE8, 0x28, 0xC8, 0x00, 0xF0, 0xF0, 0xF8, 0xF8, 0xE0, 0xE0, 0xC0, 0x80, 0x00, 0x03, 0x20, 0x13, 0x07, 0x1D, 0x3D, 0x2F, 0x07, 0x0F, 0x0F, 0x0F, 0x1F, 0x1F, 0x3F, 0x3F, 0x01, 0x3E, 0x7F, 0x1F, 0x19, 0x1E, 0x0F, 0x00, 0x7F, 0xBF, 0x7F, 0x7F, 0x3F, 0x1F, 0x7F, 0x30, 0x04, 0x06, 0xC6, 0x27, 0x67, 0x07, 0xF7, 0xE2, 0x80, 0xC0, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xFC, 0xF0, 0x10, 0xF4, 0xF4, 0xC4, 0x30, 0xE0, 0x00, 0xFC, 0xFC, 0xF0, 0xF0, 0xF0, 0xFC, 0xF8, 0x10);
    vpatch(rom, 0x12a20, 112, 0x60, 0xE0, 0x70, 0xFF, 0x61, 0x1E, 0x01, 0x00, 0x7F, 0xFF, 0xFF, 0x3F, 0x1F, 0x1F, 0x0F, 0x00, 0x03, 0x07, 0x0E, 0xF8, 0xC0, 0x38, 0xF8, 0x00, 0xFF, 0xFF, 0xFE, 0xF8, 0xF8, 0xF8, 0xF8, 0xF0, 0x00, 0x00, 0x0F, 0x1B, 0x04, 0x0F, 0x0F, 0x25, 0x01, 0x03, 0x00, 0x04, 0x07, 0x0F, 0x1F, 0x3F, 0x00, 0x06, 0x0F, 0x03, 0x23, 0xF9, 0xF7, 0xA3, 0x80, 0xC6, 0xEF, 0xEF, 0xEF, 0xF7, 0xF9, 0xFF, 0xC0, 0xC0, 0xF0, 0x7F, 0xE3, 0x7C, 0x0F, 0x00, 0xFF, 0xFF, 0xFF, 0xFF, 0x3F, 0x1F, 0x0F, 0x0F, 0x07, 0x07, 0x0E, 0xF8, 0x80, 0x78, 0x80, 0x00, 0xFF, 0xFF, 0xFE, 0xF8, 0xF8, 0xF8, 0xF0, 0x00, 0x00, 0x00, 0x07, 0x0B, 0x1C, 0x0F, 0x0F, 0x65, 0x01, 0x03, 0x00, 0x04, 0x07, 0x0F, 0x1F, 0x7F);
    vpatch(rom, 0x12aa0,  16, 0x0F, 0xF0, 0xFF, 0xFF, 0xCE, 0xF1, 0x7E, 0x00, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xC3);
    vpatch(rom, 0x12ac0,  16, 0x00, 0x06, 0x0F, 0x03, 0x23, 0xF9, 0xF7, 0xA7, 0x80, 0xC6, 0xEF, 0xEF, 0xEF, 0xF7, 0xF9, 0xFD);
    vpatch(rom, 0x12ae0,  16, 0x07, 0xF8, 0xFF, 0xF3, 0x07, 0xF1, 0x7E, 0x00, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0x7E, 0x3C);
    vpatch(rom, 0x12b50,  16, 0x00, 0x00, 0x7A, 0xB7, 0x4A, 0x32, 0x86, 0xFE, 0x30, 0x78, 0xFC, 0xFC, 0xFE, 0xFF, 0xFF, 0xFF);
    vpatch(rom, 0x12b80,  32, 0x00, 0x04, 0x7A, 0xB4, 0x4A, 0x32, 0x86, 0xFE, 0x30, 0x78, 0xFC, 0xFC, 0xFE, 0xFE, 0xFF, 0xFF, 0x00, 0x18, 0x86, 0x59, 0x3B, 0xE8, 0xEF, 0x7F, 0x3C, 0x7E, 0x7E, 0xBF, 0xFF, 0xFF, 0xFF, 0xFF);
    vpatch(rom, 0x12bd0,  16,0x00, 0x18, 0x06, 0xD9, 0x3B, 0xE8, 0xEF, 0x7F, 0x3C, 0x7E, 0x7E, 0x3F, 0xFF, 0xFF, 0xFF, 0xFF);
}